

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O1

FrameStatus __thiscall Http2::Frame::validateHeader(Frame *this)

{
  pointer puVar1;
  quint32 qVar2;
  FrameType FVar3;
  quint32 qVar4;
  
  qVar4 = payloadSize(this);
  FVar3 = type(this);
  switch(FVar3) {
  case PRIORITY:
    if (qVar4 != 5) {
      return sizeError;
    }
    break;
  case RST_STREAM:
  case WINDOW_UPDATE:
    if (qVar4 != 4) {
      return sizeError;
    }
    break;
  case SETTINGS:
    puVar1 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) < 5) {
      validateHeader();
    }
    qVar2 = qVar4 + (int)((ulong)qVar4 * 0x2aaaaaab >> 0x20) * -6;
    if ((puVar1[4] & 1) != 0) {
      qVar2 = qVar4;
    }
    if (qVar2 != 0) {
      return sizeError;
    }
    break;
  case PUSH_PROMISE:
    if (qVar4 < 4) {
      return sizeError;
    }
    break;
  case PING:
    if (qVar4 != 8) {
      return sizeError;
    }
    break;
  case GOAWAY:
    if (qVar4 < 8) {
      return sizeError;
    }
  }
  return goodFrame;
}

Assistant:

FrameStatus Frame::validateHeader() const
{
    // Should be called only on a frame with
    // a complete header.
    Q_ASSERT(buffer.size() >= frameHeaderSize);

    const auto framePayloadSize = payloadSize();
    // 4.2 Frame Size
    if (framePayloadSize > maxPayloadSize)
        return FrameStatus::sizeError;

    switch (type()) {
    case FrameType::SETTINGS:
        // SETTINGS ACK can not have any payload.
        // The payload of a SETTINGS frame consists of zero
        // or more parameters, each consisting of an unsigned
        // 16-bit setting identifier and an unsigned 32-bit value.
        // Thus the payload size must be a multiple of 6.
        if (flags().testFlag(FrameFlag::ACK) ? framePayloadSize : framePayloadSize % 6)
            return FrameStatus::sizeError;
        break;
    case FrameType::PRIORITY:
        // 6.3 PRIORITY
        if (framePayloadSize != 5)
            return FrameStatus::sizeError;
        break;
    case FrameType::PING:
        // 6.7 PING
        if (framePayloadSize != 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::GOAWAY:
        // 6.8 GOAWAY
        if (framePayloadSize < 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::RST_STREAM:
    case FrameType::WINDOW_UPDATE:
        // 6.4 RST_STREAM, 6.9 WINDOW_UPDATE
        if (framePayloadSize != 4)
            return FrameStatus::sizeError;
        break;
    case FrameType::PUSH_PROMISE:
        // 6.6 PUSH_PROMISE
        if (framePayloadSize < 4)
            return FrameStatus::sizeError;
        break;
    default:
        // DATA/HEADERS/CONTINUATION will be verified
        // when we have payload.
        // Frames of unknown types are ignored (5.1)
        break;
    }

    return FrameStatus::goodFrame;
}